

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

void __thiscall QPushButton::keyPressEvent(QPushButton *this,QKeyEvent *e)

{
  long lVar1;
  bool bVar2;
  
  if ((*(uint *)(e + 0x40) & 0xfffffffe) == 0x1000004) {
    lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    bVar2 = autoDefault(this);
    if ((bVar2) || ((*(byte *)(lVar1 + 0x2c8) & 4) != 0)) {
      QAbstractButton::click(&this->super_QAbstractButton);
      return;
    }
  }
  QAbstractButton::keyPressEvent(&this->super_QAbstractButton,e);
  return;
}

Assistant:

void QPushButton::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPushButton);
    switch (e->key()) {
    case Qt::Key_Enter:
    case Qt::Key_Return:
        if (autoDefault() || d->defaultButton) {
            click();
            break;
        }
        Q_FALLTHROUGH();
    default:
        QAbstractButton::keyPressEvent(e);
    }
}